

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O1

void mandelbrot_calc(ImageSize *image,Section *section,int max_iterations,
                    vector<int,_std::allocator<int>_> *iterations_histogram,
                    vector<CalculationResult,_std::allocator<CalculationResult>_> *results_per_point
                    )

{
  int *piVar1;
  double dVar2;
  double dVar3;
  pointer __s;
  pointer piVar4;
  pointer pCVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double __x;
  double local_88;
  
  iVar9 = image->width;
  dVar15 = section->height;
  iVar7 = image->height;
  dVar2 = section->center_x;
  dVar3 = section->center_y;
  __s = (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start;
  piVar4 = (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != piVar4) {
    memset(__s,0,((long)piVar4 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  iVar8 = image->height;
  if (0 < iVar8) {
    dVar13 = ((double)iVar9 / (double)iVar7) * dVar15 * 0.5;
    dVar15 = dVar15 * 0.5;
    lVar6 = 0;
    local_88 = 0.0;
    iVar9 = 0;
    do {
      dVar10 = std::__lerp<double>(dVar15 + dVar3,dVar3 - dVar15,(double)iVar9 / (double)iVar8);
      iVar7 = image->width;
      if (0 < iVar7) {
        lVar6 = (long)(int)lVar6;
        iVar8 = 0;
        do {
          dVar11 = std::__lerp<double>(dVar2 - dVar13,dVar13 + dVar2,(double)iVar8 / (double)iVar7);
          dVar17 = 0.0;
          iVar7 = 0;
          dVar16 = 0.0;
          do {
            if (max_iterations <= iVar7) break;
            dVar14 = dVar17 * dVar17;
            __x = dVar14 + dVar16 * dVar16;
            if (400.0 <= __x) {
              if (__x < 0.0) {
                local_88 = sqrt(__x);
              }
              else {
                local_88 = SQRT(__x);
              }
            }
            else {
              dVar17 = (dVar16 + dVar16) * dVar17 + dVar10;
              iVar7 = iVar7 + 1;
              dVar16 = (dVar16 * dVar16 - dVar14) + dVar11;
            }
          } while (__x < 400.0);
          fVar12 = 0.0;
          if (iVar7 < max_iterations) {
            piVar1 = (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + iVar7;
            *piVar1 = *piVar1 + 1;
            dVar16 = log(local_88);
            dVar16 = log(dVar16);
            fVar12 = (float)((dVar16 + -1.0971887003649488) / 0.6931471805599453);
            if (1.0 <= fVar12) {
              fVar12 = 1.0;
            }
            fVar12 = 1.0 - fVar12;
          }
          pCVar5 = (results_per_point->
                   super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pCVar5[lVar6].iter = iVar7;
          pCVar5[lVar6].distance_to_next_iteration = fVar12;
          lVar6 = lVar6 + 1;
          iVar8 = iVar8 + 1;
          iVar7 = image->width;
        } while (iVar8 < iVar7);
      }
      iVar9 = iVar9 + 1;
      iVar8 = image->height;
    } while (iVar9 < iVar8);
  }
  return;
}

Assistant:

void mandelbrot_calc(const ImageSize& image, const Section& section, const int max_iterations,
                     std::vector<int>& iterations_histogram, std::vector<CalculationResult>& results_per_point) noexcept
{
    const double width = section.height * (static_cast<double>(image.width) / static_cast<double>(image.height));

    const double x_left   = section.center_x - width / 2.0;
    const double x_right  = section.center_x + width / 2.0;
    const double y_top    = section.center_y + section.height / 2.0;
    const double y_bottom = section.center_y - section.height / 2.0;

    constexpr double bailout = 20.0;
    constexpr double bailout_squared = bailout * bailout;
    const double log_log_bailout = std::log(std::log(bailout));
    const double log_2 = std::log(2.0);

    double final_magnitude = 0.0;

    std::fill(iterations_histogram.begin(), iterations_histogram.end(), 0);

    int pixel = 0;

    for (int pixel_y = 0; pixel_y < image.height; ++pixel_y) {
        const double y0 = std::lerp(y_top, y_bottom, static_cast<double>(pixel_y) / static_cast<double>(image.height));

        for (int pixel_x = 0; pixel_x < image.width; ++pixel_x) {
            const double x0 = std::lerp(x_left, x_right, static_cast<double>(pixel_x) / static_cast<double>(image.width));

            double x = 0.0;
            double y = 0.0;

            // iteration, will be from 1 .. max_iterations once the loop is done
            int iter = 0;

            while (iter < max_iterations) {
                const double x_squared = x * x;
                const double y_squared = y * y;

                if (x_squared + y_squared >= bailout_squared) {
                    final_magnitude = std::sqrt(x_squared + y_squared);
                    break;
                }

                const double xtemp = x_squared - y_squared + x0;
                y = 2.0 * x * y + y0;
                x = xtemp;

                ++iter;
            }

            if (iter < max_iterations) {
                ++iterations_histogram[static_cast<std::size_t>(iter)]; // iter: 1 .. max_iterations-1, no need to count iterations_histogram[max_iterations]
                results_per_point[static_cast<std::size_t>(pixel)] = CalculationResult{iter, 1.0f - std::min(1.0f, static_cast<float>((std::log(std::log(final_magnitude)) - log_log_bailout) / log_2))};
            } else {
                results_per_point[static_cast<std::size_t>(pixel)] = CalculationResult{iter, 0.0};
            }

            ++pixel;
        }
    }
}